

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O2

void VP8LSubtractGreenFromBlueAndRed_C(uint32_t *argb_data,int num_pixels)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)num_pixels;
  if (num_pixels < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = argb_data[uVar2];
    argb_data[uVar2] =
         uVar1 + (uVar1 >> 8) * -0x10000 & 0xff0000 |
         uVar1 & 0xff00ff00 | uVar1 - (uVar1 >> 8) & 0xff;
  }
  return;
}

Assistant:

void VP8LSubtractGreenFromBlueAndRed_C(uint32_t* argb_data, int num_pixels) {
  int i;
  for (i = 0; i < num_pixels; ++i) {
    const int argb = argb_data[i];
    const int green = (argb >> 8) & 0xff;
    const uint32_t new_r = (((argb >> 16) & 0xff) - green) & 0xff;
    const uint32_t new_b = (((argb >>  0) & 0xff) - green) & 0xff;
    argb_data[i] = (argb & 0xff00ff00u) | (new_r << 16) | new_b;
  }
}